

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O2

void __thiscall FDrawInfo::StartScene(FDrawInfo *this)

{
  long lVar1;
  
  ClearBuffers(this);
  TArray<unsigned_char,_unsigned_char>::Resize(&this->sectorrenderflags,numsectors);
  TArray<unsigned_char,_unsigned_char>::Resize(&this->ss_renderflags,numsubsectors);
  TArray<unsigned_char,_unsigned_char>::Resize(&this->no_renderflags,numsubsectors);
  memset((this->sectorrenderflags).Array,0,(long)numsectors);
  memset((this->ss_renderflags).Array,0,(long)numsubsectors);
  memset((this->no_renderflags).Array,0,(long)numnodes);
  this->next = gl_drawinfo;
  gl_drawinfo = this;
  for (lVar1 = 0xe0; lVar1 != 0x3a0; lVar1 = lVar1 + 0x58) {
    GLDrawList::Reset((GLDrawList *)(&this->temporary + lVar1));
  }
  if (this->dldrawlists != (GLDrawList *)0x0) {
    for (lVar1 = 0; lVar1 != 0x2c0; lVar1 = lVar1 + 0x58) {
      GLDrawList::Reset((GLDrawList *)((long)&(this->dldrawlists->walls).Array + lVar1));
    }
  }
  return;
}

Assistant:

void FDrawInfo::StartScene()
{
	ClearBuffers();

	sectorrenderflags.Resize(numsectors);
	ss_renderflags.Resize(numsubsectors);
	no_renderflags.Resize(numsubsectors);

	memset(&sectorrenderflags[0], 0, numsectors * sizeof(sectorrenderflags[0]));
	memset(&ss_renderflags[0], 0, numsubsectors * sizeof(ss_renderflags[0]));
	memset(&no_renderflags[0], 0, numnodes * sizeof(no_renderflags[0]));

	next = gl_drawinfo;
	gl_drawinfo = this;
	for (int i = 0; i < GLDL_TYPES; i++) drawlists[i].Reset();
	if (dldrawlists != NULL)
	{
		for (int i = 0; i < GLLDL_TYPES; i++) dldrawlists[i].Reset();
	}
}